

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlAddEncodingAlias(char *name,char *alias)

{
  __int32_t _Var1;
  int iVar2;
  __int32_t **pp_Var3;
  xmlCharEncodingAliasPtr pxVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  char upper [100];
  char local_98 [104];
  
  iVar7 = -1;
  if (alias != (char *)0x0 && name != (char *)0x0) {
    uVar10 = 0;
    pp_Var3 = __ctype_toupper_loc();
    do {
      _Var1 = (*pp_Var3)[(byte)alias[uVar10]];
      local_98[uVar10] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_0012b3f3;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 99);
    uVar10 = 99;
LAB_0012b3f3:
    local_98[uVar10 & 0xffffffff] = '\0';
    pxVar4 = xmlCharEncodingAliases;
    uVar9 = xmlCharEncodingAliasesMax;
    if (xmlCharEncodingAliasesMax <= xmlCharEncodingAliasesNb) {
      if (xmlCharEncodingAliasesMax < 1) {
        uVar9 = 0x14;
      }
      else {
        uVar9 = 0xffffffff;
        if (xmlCharEncodingAliasesMax < 1000000000) {
          uVar8 = xmlCharEncodingAliasesMax + 1U >> 1;
          uVar9 = uVar8 + xmlCharEncodingAliasesMax;
          if ((int)(1000000000 - uVar8) < xmlCharEncodingAliasesMax) {
            uVar9 = 1000000000;
          }
        }
      }
      if ((int)uVar9 < 0) {
        return -1;
      }
      pxVar4 = (xmlCharEncodingAliasPtr)(*xmlRealloc)(xmlCharEncodingAliases,(ulong)uVar9 << 4);
      if (pxVar4 == (xmlCharEncodingAliasPtr)0x0) {
        return -1;
      }
    }
    xmlCharEncodingAliasesMax = uVar9;
    xmlCharEncodingAliases = pxVar4;
    pxVar4 = xmlCharEncodingAliases;
    lVar12 = (long)xmlCharEncodingAliasesNb;
    if (0 < lVar12) {
      lVar11 = 0;
      do {
        iVar2 = strcmp(*(char **)((long)&pxVar4->alias + lVar11),local_98);
        if (iVar2 == 0) {
          pcVar5 = (*xmlMemStrdup)(name);
          if (pcVar5 == (char *)0x0) {
            return -1;
          }
          (*xmlFree)(*(void **)((long)&xmlCharEncodingAliases->name + lVar11));
          *(char **)((long)&xmlCharEncodingAliases->name + lVar11) = pcVar5;
          goto LAB_0012b51b;
        }
        lVar11 = lVar11 + 0x10;
      } while (lVar12 * 0x10 != lVar11);
    }
    pcVar5 = (*xmlMemStrdup)(name);
    if (pcVar5 != (char *)0x0) {
      pcVar6 = (*xmlMemStrdup)(local_98);
      pxVar4 = xmlCharEncodingAliases;
      if (pcVar6 == (char *)0x0) {
        (*xmlFree)(pcVar5);
      }
      else {
        lVar12 = (long)xmlCharEncodingAliasesNb;
        xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + 1;
        xmlCharEncodingAliases[lVar12].name = pcVar5;
        pxVar4[lVar12].alias = pcVar6;
LAB_0012b51b:
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int
xmlAddEncodingAlias(const char *name, const char *alias) {
    int i;
    char upper[100];
    char *nameCopy, *aliasCopy;

    if ((name == NULL) || (alias == NULL))
	return(-1);

    for (i = 0;i < 99;i++) {
        upper[i] = (char) toupper((unsigned char) alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (xmlCharEncodingAliasesNb >= xmlCharEncodingAliasesMax) {
        xmlCharEncodingAliasPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(xmlCharEncodingAliasesMax, sizeof(tmp[0]),
                                  20, XML_MAX_ITEMS);
        if (newSize < 0)
            return(-1);
        tmp = xmlRealloc(xmlCharEncodingAliases, newSize * sizeof(tmp[0]));
        if (tmp == NULL)
            return(-1);
        xmlCharEncodingAliases = tmp;
        xmlCharEncodingAliasesMax = newSize;
    }

    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    /*
	     * Replace the definition.
	     */
	    nameCopy = xmlMemStrdup(name);
            if (nameCopy == NULL)
                return(-1);
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlCharEncodingAliases[i].name = nameCopy;
	    return(0);
	}
    }
    /*
     * Add the definition
     */
    nameCopy = xmlMemStrdup(name);
    if (nameCopy == NULL)
        return(-1);
    aliasCopy = xmlMemStrdup(upper);
    if (aliasCopy == NULL) {
        xmlFree(nameCopy);
        return(-1);
    }
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = nameCopy;
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = aliasCopy;
    xmlCharEncodingAliasesNb++;
    return(0);
}